

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<0,_8,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  float local_88;
  VecAccess<float,_4,_3> local_80;
  Matrix<float,_2,_3> local_68;
  Vector<float,_3> local_50 [2];
  float local_34;
  undefined1 local_30 [4];
  Type_conflict in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[2].m_data[0] = (float)in1Type;
  in0.m_data.m_data[2].m_data[1] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,8>
              ((Mat3x2 *)local_30,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,8>
              ((Mat3x2 *)local_30,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  if (in0.m_data.m_data[2].m_data[0] == 2.8026e-45) {
    local_88 = sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,1>(evalCtx,1);
  }
  else {
    local_88 = sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,1>(evalCtx,1);
  }
  local_34 = local_88;
  tcu::operator+(&local_68,(Matrix<float,_2,_3> *)local_30,local_88);
  reduceToVec3((MatrixCaseUtils *)local_50,&local_68);
  tcu::Vector<float,_4>::xyz(&local_80,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,local_50);
  tcu::Matrix<float,_2,_3>::~Matrix(&local_68);
  tcu::Matrix<float,_2,_3>::~Matrix((Matrix<float,_2,_3> *)local_30);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}